

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O0

UByteArray * __thiscall
UByteArray::left(UByteArray *__return_storage_ptr__,UByteArray *this,int32_t len)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int32_t local_1c;
  UByteArray *pUStack_18;
  int32_t len_local;
  UByteArray *this_local;
  
  local_1c = len;
  pUStack_18 = this;
  this_local = __return_storage_ptr__;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)this);
  UByteArray(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

UByteArray left(int32_t len) const { return d.substr(0, len); }